

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  undefined8 *puVar1;
  const_iterator cVar2;
  size_t i;
  _Rb_tree_header *p_Var3;
  ulong uVar4;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
                  *)this,variable);
  p_Var3 = &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)cVar2._M_node[2]._M_parent - *(long *)(cVar2._M_node + 2) >> 3);
        uVar4 = uVar4 + 1) {
      puVar1 = *(undefined8 **)(*(long *)(cVar2._M_node + 2) + uVar4 * 8);
      (*(code *)*puVar1)(variable,access_type,puVar1[1],newValue,mf);
    }
  }
  return (_Rb_tree_header *)cVar2._M_node != p_Var3;
}

Assistant:

bool cmVariableWatch::VariableAccessed(const std::string& variable,
                                       int access_type, const char* newValue,
                                       const cmMakefile* mf) const
{
  cmVariableWatch::StringToVectorOfPairs::const_iterator mit =
    this->WatchMap.find(variable);
  if (mit != this->WatchMap.end()) {
    const cmVariableWatch::VectorOfPairs* vp = &mit->second;
    cmVariableWatch::VectorOfPairs::const_iterator it;
    for (size_t i = 0; i < vp->size(); i++) {
      auto& cbData = (*vp)[i];
      cbData->Method(variable, access_type, cbData->ClientData, newValue, mf);
    }
    return true;
  }
  return false;
}